

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMEntityImpl::cloneEntityRefTree(DOMEntityImpl *this)

{
  DOMEntityImpl *ncThis;
  DOMEntityImpl *this_local;
  
  if ((((this->fEntityRefNodeCloned & 1U) == 0) && ((this->fParent).fFirstChild == (DOMNode *)0x0))
     && (this->fRefEntity != (DOMEntityReference *)0x0)) {
    this->fEntityRefNodeCloned = true;
    DOMNodeImpl::setReadOnly(&this->fNode,false,true);
    DOMParentNode::cloneChildren(&this->fParent,&this->fRefEntity->super_DOMNode);
    DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  }
  return;
}

Assistant:

void  DOMEntityImpl::cloneEntityRefTree() const
{
    if (fEntityRefNodeCloned)
        return;

    // cast off const.  This method is const because it is
    //   called from a bunch of logically const methods, like
    //   getFirstChild().
    DOMEntityImpl *ncThis = (DOMEntityImpl *)this;

    //lazily clone the entityRef tree to this entity
    if (fParent.fFirstChild != 0)
        return;

    if (!fRefEntity)
        return;

    ncThis->fEntityRefNodeCloned = true;
    ncThis->fNode.setReadOnly(false, true);
    ncThis->fParent.cloneChildren(fRefEntity);
    ncThis->fNode.setReadOnly(true, true);
}